

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_get_cwd(char *cwd,int *status)

{
  char *pcVar1;
  int *in_RSI;
  int *in_RDI;
  char buff [1025];
  char acStack_428 [1040];
  int *local_18;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar2;
  
  if (*in_RSI == 0) {
    local_18 = in_RSI;
    pcVar1 = getcwd(acStack_428,0x401);
    if (pcVar1 == (char *)0x0) {
      *(undefined1 *)in_RDI = 0;
      ffpmsg((char *)0x1d1aa1);
      *local_18 = 0x7d;
      iVar2 = 0x7d;
    }
    else {
      fits_path2url((char *)buff._8_8_,buff._4_4_,
                    (char *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI);
      iVar2 = *local_18;
    }
  }
  else {
    iVar2 = *in_RSI;
  }
  return iVar2;
}

Assistant:

int fits_get_cwd(char *cwd,  /* IO current working directory string */
		 int  *status)
  /*
     retrieve the string containing the current working directory absolute
     path in Unix-like URL standard notation. It is assumed that the CWD
     string has a size of at least FLEN_FILENAME.

     Note that this process is platform dependent. This
     function supports Unix, MSDOS/WIN32, VMS and Macintosh platforms. Each
     platform dependent code segment is conditionally compiled depending 
     upon the setting of the appropriate C preprocesser macros.
   */
{

  char buff[FLEN_FILENAME];


  if(*status != 0) return(*status);

#if defined(macintosh)

  /*
     MacOS case. Currently unknown !!!!
  */

  *buff = 0;

#else
  /*
    Good old getcwd() seems to work with all other platforms
  */

  if (!getcwd(buff,FLEN_FILENAME))
  {
     cwd[0]=0;
     ffpmsg("Path and file name too long (fits_get_cwd)");
     return (*status=URL_PARSE_ERROR);
  }

#endif

  /*
    convert the cwd string to a URL standard path string
  */

  fits_path2url(buff,FLEN_FILENAME,cwd,status);

  return(*status);
}